

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall
compressed_sparse_matrix<filtration_entry_t>::append_column
          (compressed_sparse_matrix<filtration_entry_t> *this)

{
  size_type local_18;
  compressed_sparse_matrix<filtration_entry_t> *local_10;
  compressed_sparse_matrix<filtration_entry_t> *this_local;
  
  local_10 = this;
  local_18 = std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>::size
                       (&this->entries);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->bounds,&local_18);
  return;
}

Assistant:

void append_column() { bounds.push_back(entries.size()); }